

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O2

int secp256k1_fe_cmp_var(secp256k1_fe *a,secp256k1_fe *b)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = 4;
  while( true ) {
    if ((int)uVar1 < 0) {
      return 0;
    }
    uVar2 = (ulong)uVar1;
    uVar3 = (ulong)uVar1;
    if (secp256k1_ecdsa_const_p_minus_order.n[uVar3] < a->n[uVar2]) break;
    uVar1 = uVar1 - 1;
    if (a->n[uVar2] < secp256k1_ecdsa_const_p_minus_order.n[uVar3]) {
      return -1;
    }
  }
  return 1;
}

Assistant:

static int secp256k1_fe_cmp_var(const secp256k1_fe *a, const secp256k1_fe *b) {
    int i;
#ifdef VERIFY
    VERIFY_CHECK(a->normalized);
    VERIFY_CHECK(b->normalized);
    secp256k1_fe_verify(a);
    secp256k1_fe_verify(b);
#endif
    for (i = 4; i >= 0; i--) {
        if (a->n[i] > b->n[i]) {
            return 1;
        }
        if (a->n[i] < b->n[i]) {
            return -1;
        }
    }
    return 0;
}